

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ip-name.c
# Opt level: O2

int run_test_ip_name(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_b_1;
  char dst [46];
  TestAddr test_addr;
  
  iVar1 = uv_ip4_addr("192.168.0.1",0x23a3,&test_addr.addr4);
  eval_b = (int64_t)iVar1;
  dst._0_8_ = eval_b;
  if (eval_b == 0) {
    iVar1 = uv_ip4_name(&test_addr.addr4,dst,0x10);
    eval_b = (int64_t)iVar1;
    eval_b_1 = 0;
    if (eval_b == 0) {
      iVar1 = strcmp("192.168.0.1",dst);
      eval_b = (int64_t)iVar1;
      eval_b_1 = 0;
      if (eval_b == 0) {
        iVar1 = uv_ip_name(&test_addr.addr,dst,0x10);
        eval_b = (int64_t)iVar1;
        eval_b_1 = 0;
        if (eval_b == 0) {
          iVar1 = strcmp("192.168.0.1",dst);
          eval_b = (int64_t)iVar1;
          eval_b_1 = 0;
          if (eval_b == 0) {
            iVar1 = uv_ip6_addr("fe80::2acf:daff:fedd:342a",0x23a3,&test_addr.addr6);
            eval_b = (int64_t)iVar1;
            eval_b_1 = 0;
            if (eval_b == 0) {
              iVar1 = uv_ip6_name(&test_addr.addr6,dst,0x2e);
              eval_b = (int64_t)iVar1;
              eval_b_1 = 0;
              if (eval_b == 0) {
                iVar1 = strcmp("fe80::2acf:daff:fedd:342a",dst);
                eval_b = (int64_t)iVar1;
                eval_b_1 = 0;
                if (eval_b == 0) {
                  iVar1 = uv_ip_name(&test_addr.addr,dst,0x2e);
                  eval_b = (int64_t)iVar1;
                  eval_b_1 = 0;
                  if (eval_b == 0) {
                    iVar1 = strcmp("fe80::2acf:daff:fedd:342a",dst);
                    eval_b = (int64_t)iVar1;
                    eval_b_1 = 0;
                    if (eval_b == 0) {
                      test_addr.addr.sa_family = 1;
                      eval_b = -0x61;
                      iVar1 = uv_ip_name(&test_addr.addr,dst,0x2e);
                      eval_b_1 = (int64_t)iVar1;
                      if (eval_b_1 == -0x61) {
                        puVar2 = uv_default_loop();
                        uv_walk(puVar2,close_walk_cb,(void *)0x0);
                        uv_run(puVar2,UV_RUN_DEFAULT);
                        eval_b = 0;
                        puVar2 = uv_default_loop();
                        iVar1 = uv_loop_close(puVar2);
                        eval_b_1 = (int64_t)iVar1;
                        if (eval_b_1 == 0) {
                          uv_library_shutdown();
                          return 0;
                        }
                        pcVar4 = "uv_loop_close(uv_default_loop())";
                        pcVar3 = "0";
                        uVar5 = 0x3f;
                      }
                      else {
                        pcVar4 = "uv_ip_name(addr, dst, 46)";
                        pcVar3 = "UV_EAFNOSUPPORT";
                        uVar5 = 0x3d;
                      }
                    }
                    else {
                      pcVar4 = "0";
                      pcVar3 = "strcmp(\"fe80::2acf:daff:fedd:342a\", dst)";
                      uVar5 = 0x38;
                    }
                  }
                  else {
                    pcVar4 = "0";
                    pcVar3 = "uv_ip_name(addr, dst, 46)";
                    uVar5 = 0x37;
                  }
                }
                else {
                  pcVar4 = "0";
                  pcVar3 = "strcmp(\"fe80::2acf:daff:fedd:342a\", dst)";
                  uVar5 = 0x35;
                }
              }
              else {
                pcVar4 = "0";
                pcVar3 = "uv_ip6_name(addr6, dst, 46)";
                uVar5 = 0x34;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "uv_ip6_addr(\"fe80::2acf:daff:fedd:342a\", 9123, addr6)";
              uVar5 = 0x33;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "strcmp(\"192.168.0.1\", dst)";
            uVar5 = 0x30;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_ip_name(addr, dst, 16)";
          uVar5 = 0x2f;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "strcmp(\"192.168.0.1\", dst)";
        uVar5 = 0x2d;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "uv_ip4_name(addr4, dst, 16)";
      uVar5 = 0x2c;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_ip4_addr(\"192.168.0.1\", 9123, addr4)";
    uVar5 = 0x2b;
    eval_b_1 = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ip-name.c"
          ,uVar5,pcVar3,"==",pcVar4,eval_b,"==",eval_b_1);
  abort();
}

Assistant:

TEST_IMPL(ip_name) {
    char dst[INET6_ADDRSTRLEN];
    union TestAddr test_addr;
    struct sockaddr* addr = &test_addr.addr;
    struct sockaddr_in* addr4 = &test_addr.addr4;
    struct sockaddr_in6* addr6 = &test_addr.addr6;

    /* test ip4_name */
    ASSERT_OK(uv_ip4_addr("192.168.0.1", TEST_PORT, addr4));
    ASSERT_OK(uv_ip4_name(addr4, dst, INET_ADDRSTRLEN));
    ASSERT_OK(strcmp("192.168.0.1", dst));

    ASSERT_OK(uv_ip_name(addr, dst, INET_ADDRSTRLEN));
    ASSERT_OK(strcmp("192.168.0.1", dst));

    /* test ip6_name */
    ASSERT_OK(uv_ip6_addr("fe80::2acf:daff:fedd:342a", TEST_PORT, addr6));
    ASSERT_OK(uv_ip6_name(addr6, dst, INET6_ADDRSTRLEN));
    ASSERT_OK(strcmp("fe80::2acf:daff:fedd:342a", dst));

    ASSERT_OK(uv_ip_name(addr, dst, INET6_ADDRSTRLEN));
    ASSERT_OK(strcmp("fe80::2acf:daff:fedd:342a", dst));

    /* test other sa_family */
    addr->sa_family = AF_UNIX;
    /* size is not a concern here */
    ASSERT_EQ(UV_EAFNOSUPPORT, uv_ip_name(addr, dst, INET6_ADDRSTRLEN));

    MAKE_VALGRIND_HAPPY(uv_default_loop());
    return 0;
}